

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

int __thiscall
cmMakefile::TryCompile
          (cmMakefile *this,string *srcdir,string *bindir,string *projectName,string *targetName,
          bool fast,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *cmakeArgs,string *output)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  cmGlobalGenerator *gg;
  char *pcVar4;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 collapse;
  allocator local_2e9;
  string local_2e8;
  string *local_2c8;
  string *local_2c0;
  string *local_2b8;
  string cwd;
  cmake cm;
  
  ((this->Internal).x_)->IsSourceFileTryCompile = fast;
  local_2c8 = srcdir;
  local_2c0 = projectName;
  local_2b8 = targetName;
  bVar1 = cmsys::SystemTools::FileIsDirectory(bindir);
  collapse = extraout_DL;
  if (!bVar1) {
    cmsys::SystemTools::MakeDirectory((bindir->_M_dataplus)._M_p);
    collapse = extraout_DL_00;
  }
  cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_(&cwd,(SystemTools *)0x1,(bool)collapse);
  cmsys::SystemTools::ChangeDirectory(bindir);
  cmake::cmake(&cm);
  iVar3 = 1;
  cmake::SetIsInTryCompile(&cm,true);
  (*this->LocalGenerator->GlobalGenerator->_vptr_cmGlobalGenerator[2])(&local_2e8);
  gg = cmake::CreateGlobalGenerator(&cm,&local_2e8);
  std::__cxx11::string::~string((string *)&local_2e8);
  if (gg == (cmGlobalGenerator *)0x0) {
    pcVar4 = "Internal CMake error, TryCompile bad GlobalGenerator";
  }
  else {
    cmake::SetGlobalGenerator(&cm,gg);
    cmake::SetHomeDirectory(&cm,local_2c8);
    cmake::SetHomeOutputDirectory(&cm,bindir);
    std::__cxx11::string::_M_assign((string *)&cm.GeneratorPlatform);
    std::__cxx11::string::_M_assign((string *)&cm.GeneratorToolset);
    cmake::LoadCache(&cm);
    iVar2 = (*gg->_vptr_cmGlobalGenerator[0x1b])(gg);
    if ((char)iVar2 == '\0') {
      std::__cxx11::string::string
                ((string *)&local_2e8,"CMAKE_TRY_COMPILE_CONFIGURATION",&local_2e9);
      pcVar4 = GetDefinition(this,&local_2e8);
      std::__cxx11::string::~string((string *)&local_2e8);
      if (pcVar4 != (char *)0x0) {
        std::__cxx11::string::string((string *)&local_2e8,"CMAKE_BUILD_TYPE",&local_2e9);
        cmake::AddCacheEntry(&cm,&local_2e8,pcVar4,"Build configuration",3);
        std::__cxx11::string::~string((string *)&local_2e8);
      }
    }
    if (cmakeArgs !=
        (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x0) {
      cm.WarnUnusedCli = false;
      cmake::SetCacheArgs(&cm,cmakeArgs);
    }
    (*gg->_vptr_cmGlobalGenerator[9])(gg,this->LocalGenerator->GlobalGenerator,this);
    std::__cxx11::string::string
              ((string *)&local_2e8,"CMAKE_SUPPRESS_DEVELOPER_WARNINGS",&local_2e9);
    bVar1 = IsOn(this,&local_2e8);
    std::__cxx11::string::~string((string *)&local_2e8);
    if (bVar1) {
      std::__cxx11::string::string
                ((string *)&local_2e8,"CMAKE_SUPPRESS_DEVELOPER_WARNINGS",&local_2e9);
      cmake::AddCacheEntry(&cm,&local_2e8,"TRUE","",4);
    }
    else {
      std::__cxx11::string::string
                ((string *)&local_2e8,"CMAKE_SUPPRESS_DEVELOPER_WARNINGS",&local_2e9);
      cmake::AddCacheEntry(&cm,&local_2e8,"FALSE","",4);
    }
    std::__cxx11::string::~string((string *)&local_2e8);
    iVar2 = cmake::Configure(&cm);
    if (iVar2 == 0) {
      iVar2 = cmake::Generate(&cm);
      if (iVar2 == 0) {
        iVar3 = cmGlobalGenerator::TryCompile
                          (this->LocalGenerator->GlobalGenerator,local_2c8,bindir,local_2c0,
                           local_2b8,fast,output,this);
        cmsys::SystemTools::ChangeDirectory(&cwd);
        goto LAB_0033c7d9;
      }
      pcVar4 = "Internal CMake error, TryCompile generation of cmake failed";
    }
    else {
      pcVar4 = "Internal CMake error, TryCompile configure of cmake failed";
    }
  }
  cmSystemTools::Error(pcVar4,(char *)0x0,(char *)0x0,(char *)0x0);
  cmsys::SystemTools::ChangeDirectory(&cwd);
LAB_0033c7d9:
  ((this->Internal).x_)->IsSourceFileTryCompile = false;
  cmake::~cmake(&cm);
  std::__cxx11::string::~string((string *)&cwd);
  return iVar3;
}

Assistant:

int cmMakefile::TryCompile(const std::string& srcdir,
                           const std::string& bindir,
                           const std::string& projectName,
                           const std::string& targetName,
                           bool fast,
                           const std::vector<std::string> *cmakeArgs,
                           std::string& output)
{
  this->Internal->IsSourceFileTryCompile = fast;
  // does the binary directory exist ? If not create it...
  if (!cmSystemTools::FileIsDirectory(bindir))
    {
    cmSystemTools::MakeDirectory(bindir.c_str());
    }

  // change to the tests directory and run cmake
  // use the cmake object instead of calling cmake
  std::string cwd = cmSystemTools::GetCurrentWorkingDirectory();
  cmSystemTools::ChangeDirectory(bindir);

  // make sure the same generator is used
  // use this program as the cmake to be run, it should not
  // be run that way but the cmake object requires a vailid path
  cmake cm;
  cm.SetIsInTryCompile(true);
  cmGlobalGenerator *gg = cm.CreateGlobalGenerator
    (this->GetGlobalGenerator()->GetName());
  if (!gg)
    {
    cmSystemTools::Error(
      "Internal CMake error, TryCompile bad GlobalGenerator");
    // return to the original directory
    cmSystemTools::ChangeDirectory(cwd);
    this->Internal->IsSourceFileTryCompile = false;
    return 1;
    }
  cm.SetGlobalGenerator(gg);

  // do a configure
  cm.SetHomeDirectory(srcdir);
  cm.SetHomeOutputDirectory(bindir);
  cm.SetGeneratorPlatform(this->GetCMakeInstance()->GetGeneratorPlatform());
  cm.SetGeneratorToolset(this->GetCMakeInstance()->GetGeneratorToolset());
  cm.LoadCache();
  if(!gg->IsMultiConfig())
    {
    if(const char* config =
       this->GetDefinition("CMAKE_TRY_COMPILE_CONFIGURATION"))
      {
      // Tell the single-configuration generator which one to use.
      // Add this before the user-provided CMake arguments in case
      // one of the arguments is -DCMAKE_BUILD_TYPE=...
      cm.AddCacheEntry("CMAKE_BUILD_TYPE", config,
                       "Build configuration", cmState::STRING);
      }
    }
  // if cmake args were provided then pass them in
  if (cmakeArgs)
    {
    // FIXME: Workaround to ignore unused CLI variables in try-compile.
    //
    // Ideally we should use SetArgs to honor options like --warn-unused-vars.
    // However, there is a subtle problem when certain arguments are passed to
    // a macro wrapping around try_compile or try_run that does not escape
    // semicolons in its parameters but just passes ${ARGV} or ${ARGN}.  In
    // this case a list argument like "-DVAR=a;b" gets split into multiple
    // cmake arguments "-DVAR=a" and "b".  Currently SetCacheArgs ignores
    // argument "b" and uses just "-DVAR=a", leading to a subtle bug in that
    // the try_compile or try_run does not get the proper value of VAR.  If we
    // call SetArgs here then it would treat "b" as the source directory and
    // cause an error such as "The source directory .../CMakeFiles/CMakeTmp/b
    // does not exist", thus breaking the try_compile or try_run completely.
    //
    // Strictly speaking the bug is in the wrapper macro because the CMake
    // language has always flattened nested lists and the macro should escape
    // the semicolons in its arguments before forwarding them.  However, this
    // bug is so subtle that projects typically work anyway, usually because
    // the value VAR=a is sufficient for the try_compile or try_run to get the
    // correct result.  Calling SetArgs here would break such projects that
    // previously built.  Instead we work around the issue by never reporting
    // unused arguments and ignoring options such as --warn-unused-vars.
    cm.SetWarnUnusedCli(false);
    //cm.SetArgs(*cmakeArgs, true);

    cm.SetCacheArgs(*cmakeArgs);
    }
  // to save time we pass the EnableLanguage info directly
  gg->EnableLanguagesFromGenerator(this->GetGlobalGenerator(), this);
  if(this->IsOn("CMAKE_SUPPRESS_DEVELOPER_WARNINGS"))
    {
    cm.AddCacheEntry("CMAKE_SUPPRESS_DEVELOPER_WARNINGS",
                     "TRUE", "", cmState::INTERNAL);
    }
  else
    {
    cm.AddCacheEntry("CMAKE_SUPPRESS_DEVELOPER_WARNINGS",
                     "FALSE", "", cmState::INTERNAL);
    }
  if (cm.Configure() != 0)
    {
    cmSystemTools::Error(
      "Internal CMake error, TryCompile configure of cmake failed");
    // return to the original directory
    cmSystemTools::ChangeDirectory(cwd);
    this->Internal->IsSourceFileTryCompile = false;
    return 1;
    }

  if (cm.Generate() != 0)
    {
    cmSystemTools::Error(
      "Internal CMake error, TryCompile generation of cmake failed");
    // return to the original directory
    cmSystemTools::ChangeDirectory(cwd);
    this->Internal->IsSourceFileTryCompile = false;
    return 1;
    }

  // finally call the generator to actually build the resulting project
  int ret = this->GetGlobalGenerator()->TryCompile(srcdir,bindir,
                                                   projectName,
                                                   targetName,
                                                   fast,
                                                   output,
                                                   this);

  cmSystemTools::ChangeDirectory(cwd);
  this->Internal->IsSourceFileTryCompile = false;
  return ret;
}